

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O3

int store_oprnd(dill_stream c,int tmp_num,int vreg)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  
  if (tmp_num < 100) {
    piVar3 = &c->p->c_param_args[tmp_num].offset;
    lVar4 = 0x14;
  }
  else {
    piVar3 = &c->p->vregs[(ulong)(uint)tmp_num - 100].offset;
    lVar4 = 0x10;
  }
  iVar2 = *piVar3;
  iVar1 = dill_type_of(c,tmp_num);
  iVar2 = (*c->j->storei)(c,iVar1,0,c->p->v_tmps[iVar1][0],*(int *)((long)&c->j + lVar4),(long)iVar2
                         );
  return iVar2;
}

Assistant:

static int
store_oprnd(dill_stream c, int tmp_num, int vreg)
{
    int offset = offset_of(c, vreg);
    int typ = dill_type_of(c, vreg);
    int tmp = c->p->v_tmps[typ][tmp_num];
    if (vreg >= 100) {
        c->j->storei(c, typ, 0, tmp, c->dill_local_pointer, offset);
    } else {
        c->j->storei(c, typ, 0, tmp, c->dill_param_reg_pointer, offset);
    }
    return tmp;
}